

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_mutex_group_usage_set_metavar(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cargo_t cargo;
  int d;
  int c;
  int b;
  int a;
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    iVar1 = _test_mutex_group_usage_add_options
                      (cargo,CARGO_MUTEXGRP_GROUP_USAGE|CARGO_MUTEXGRP_ONE_REQUIRED,
                       CARGO_MUTEXGRP_RAW_DESCRIPTION|CARGO_MUTEXGRP_GROUP_USAGE,&a,&b,&c,&d);
    if (iVar1 == 0) {
      iVar1 = cargo_mutex_group_set_metavar(cargo,"mgroup1","MUTEX");
      if (iVar1 == 0) {
        cargo_print_usage(cargo,CARGO_USAGE_FULL);
        pcVar3 = cargo_get_usage(cargo,CARGO_USAGE_SHORT);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "Got NULL short usage";
        }
        else {
          pcVar2 = strstr(pcVar3,"MUTEX");
          if (pcVar2 == (char *)0x0) {
            pcVar3 = "Expected to find mutex group metavar";
          }
          else {
            pcVar2 = strstr(pcVar3,"--beta");
            if (pcVar2 == (char *)0x0) {
              pcVar3 = strstr(pcVar3,"--centauri");
              if (pcVar3 == (char *)0x0) {
                pcVar3 = (char *)0x0;
                iVar1 = cargo_mutex_group_set_metavar(cargo,"mgroup3","MUTEX");
                if (iVar1 == 0) {
                  pcVar3 = "Succeeded to set metavar on invalid mutex group";
                }
              }
              else {
                pcVar3 = "--centauri should be hidden";
              }
            }
            else {
              pcVar3 = "--beta should be hidden";
            }
          }
        }
      }
      else {
        pcVar3 = "Failed to set mutex group metavar";
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_mutex_group_usage_set_metavar)
{
    int a;
    int b;
    int c;
    int d;
    const char *s = NULL;

    ret = _test_mutex_group_usage_add_options(cargo,
            CARGO_MUTEXGRP_ONE_REQUIRED |
            CARGO_MUTEXGRP_GROUP_USAGE,
            CARGO_MUTEXGRP_GROUP_USAGE |
            CARGO_MUTEXGRP_RAW_DESCRIPTION, &a, &b, &c, &d);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_mutex_group_set_metavar(cargo, "mgroup1", "MUTEX");
    cargo_assert(ret == 0, "Failed to set mutex group metavar");

    cargo_print_usage(cargo, 0);

    s = cargo_get_usage(cargo, CARGO_USAGE_SHORT);
    cargo_assert(s, "Got NULL short usage");
    cargo_assert(strstr(s, "MUTEX"), "Expected to find mutex group metavar");
    cargo_assert(!strstr(s, "--beta"), "--beta should be hidden");
    cargo_assert(!strstr(s, "--centauri"), "--centauri should be hidden");

    // Try to set for non-existing mutex group.
    ret = cargo_mutex_group_set_metavar(cargo, "mgroup3", "MUTEX");
    cargo_assert(ret != 0, "Succeeded to set metavar on invalid mutex group");

    _TEST_CLEANUP();
}